

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O2

bool embree::avx::ConeCurveMiMBIntersectorK<4,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  byte bVar31;
  uint uVar32;
  ulong uVar33;
  uint uVar34;
  Scene *pSVar35;
  bool bVar36;
  long lVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar57;
  float fVar60;
  float fVar63;
  undefined1 auVar49 [16];
  float fVar58;
  float fVar59;
  float fVar61;
  float fVar62;
  float fVar64;
  float fVar65;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  float fVar89;
  float fVar93;
  float fVar94;
  undefined1 auVar90 [16];
  float fVar95;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar96;
  float fVar108;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [64];
  float fVar127;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [64];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [64];
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar140;
  float fVar143;
  undefined1 auVar136 [16];
  float fVar141;
  float fVar142;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [64];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [64];
  float fVar152;
  float fVar155;
  float fVar156;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar157;
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  float fVar166;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<4> hit;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_3f0 [8];
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [16];
  Scene *local_3d0;
  RayK<8> *local_3c8;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [16];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  float local_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  Primitive *local_358;
  RTCFilterFunctionNArguments local_350;
  undefined1 local_320 [16];
  float local_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  float local_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  undefined1 local_210 [16];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float local_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  
  pSVar35 = context->scene;
  uVar32 = line->sharedGeomID;
  uVar34 = (line->v0).field_0.i[0];
  pGVar7 = (pSVar35->geometries).items[uVar32].ptr;
  fVar96 = (pGVar7->time_range).lower;
  fVar96 = pGVar7->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0xe0) - fVar96) / ((pGVar7->time_range).upper - fVar96));
  auVar39 = vroundss_avx(ZEXT416((uint)fVar96),ZEXT416((uint)fVar96),9);
  auVar39 = vminss_avx(auVar39,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar97 = vmaxss_avx(ZEXT816(0),auVar39);
  lVar8 = *(long *)&pGVar7[3].time_range.upper;
  lVar37 = (long)(int)auVar97._0_4_ * 0x38;
  lVar9 = *(long *)(lVar8 + lVar37);
  lVar10 = *(long *)(lVar8 + 0x10 + lVar37);
  auVar39 = *(undefined1 (*) [16])(lVar9 + lVar10 * (ulong)uVar34);
  uVar4 = (line->v0).field_0.i[1];
  auVar52 = *(undefined1 (*) [16])(lVar9 + lVar10 * (ulong)uVar4);
  uVar5 = (line->v0).field_0.i[2];
  auVar67 = *(undefined1 (*) [16])(lVar9 + lVar10 * (ulong)uVar5);
  uVar6 = (line->v0).field_0.i[3];
  auVar40 = *(undefined1 (*) [16])(lVar9 + lVar10 * (ulong)uVar6);
  auVar49 = *(undefined1 (*) [16])(lVar9 + lVar10 * (ulong)(uVar34 + 1));
  auVar38 = *(undefined1 (*) [16])(lVar9 + lVar10 * (ulong)(uVar4 + 1));
  auVar41 = *(undefined1 (*) [16])(lVar9 + lVar10 * (ulong)(uVar5 + 1));
  auVar66 = *(undefined1 (*) [16])(lVar9 + lVar10 * (ulong)(uVar6 + 1));
  lVar9 = *(long *)(lVar8 + 0x38 + lVar37);
  lVar8 = *(long *)(lVar8 + 0x48 + lVar37);
  auVar68 = *(undefined1 (*) [16])(lVar9 + (ulong)uVar34 * lVar8);
  auVar75 = *(undefined1 (*) [16])(lVar9 + (ulong)uVar4 * lVar8);
  auVar76 = *(undefined1 (*) [16])(lVar9 + (ulong)uVar5 * lVar8);
  auVar77 = *(undefined1 (*) [16])(lVar9 + (ulong)uVar6 * lVar8);
  auVar90 = *(undefined1 (*) [16])(lVar9 + (ulong)(uVar34 + 1) * lVar8);
  auVar109 = *(undefined1 (*) [16])(lVar9 + (ulong)(uVar5 + 1) * lVar8);
  fVar96 = fVar96 - auVar97._0_4_;
  auVar97 = vunpcklps_avx(auVar39,auVar67);
  auVar39 = vunpckhps_avx(auVar39,auVar67);
  auVar67 = vunpcklps_avx(auVar52,auVar40);
  auVar52 = vunpckhps_avx(auVar52,auVar40);
  auVar110 = vunpcklps_avx(auVar97,auVar67);
  auVar67 = vunpckhps_avx(auVar97,auVar67);
  auVar97 = vunpcklps_avx(auVar39,auVar52);
  auVar40 = vunpckhps_avx(auVar39,auVar52);
  auVar111 = vunpcklps_avx(auVar49,auVar41);
  auVar39 = vunpckhps_avx(auVar49,auVar41);
  auVar49 = vunpcklps_avx(auVar38,auVar66);
  auVar52 = vunpckhps_avx(auVar38,auVar66);
  auVar112 = vunpcklps_avx(auVar111,auVar49);
  auVar49 = vunpckhps_avx(auVar111,auVar49);
  auVar111 = vunpcklps_avx(auVar39,auVar52);
  auVar38 = vunpckhps_avx(auVar39,auVar52);
  auVar41 = vunpcklps_avx(auVar68,auVar76);
  auVar39 = vunpckhps_avx(auVar68,auVar76);
  auVar66 = vunpcklps_avx(auVar75,auVar77);
  auVar52 = vunpckhps_avx(auVar75,auVar77);
  auVar76 = vunpcklps_avx(auVar41,auVar66);
  auVar41 = vunpckhps_avx(auVar41,auVar66);
  auVar77 = vunpcklps_avx(auVar39,auVar52);
  auVar66 = vunpckhps_avx(auVar39,auVar52);
  auVar75 = vunpcklps_avx(auVar90,auVar109);
  auVar68 = vunpckhps_avx(auVar90,auVar109);
  auVar39 = *(undefined1 (*) [16])(lVar9 + (ulong)(uVar4 + 1) * lVar8);
  auVar52 = *(undefined1 (*) [16])(lVar9 + lVar8 * (ulong)(uVar6 + 1));
  auVar90 = vunpcklps_avx(auVar39,auVar52);
  auVar39 = vunpckhps_avx(auVar39,auVar52);
  auVar109 = vunpcklps_avx(auVar75,auVar90);
  auVar75 = vunpckhps_avx(auVar75,auVar90);
  auVar90 = vunpcklps_avx(auVar68,auVar39);
  auVar68 = vunpckhps_avx(auVar68,auVar39);
  auVar39 = vshufps_avx(ZEXT416((uint)fVar96),ZEXT416((uint)fVar96),0);
  auVar52 = vshufps_avx(ZEXT416((uint)(1.0 - fVar96)),ZEXT416((uint)(1.0 - fVar96)),0);
  fVar96 = auVar39._0_4_;
  fVar108 = auVar39._4_4_;
  fVar127 = auVar39._8_4_;
  fVar46 = auVar39._12_4_;
  fVar57 = auVar52._0_4_;
  fVar60 = auVar52._4_4_;
  fVar63 = auVar52._8_4_;
  fVar166 = auVar52._12_4_;
  auVar149._0_4_ = fVar57 * auVar110._0_4_ + fVar96 * auVar76._0_4_;
  auVar149._4_4_ = fVar60 * auVar110._4_4_ + fVar108 * auVar76._4_4_;
  auVar149._8_4_ = fVar63 * auVar110._8_4_ + fVar127 * auVar76._8_4_;
  auVar149._12_4_ = fVar166 * auVar110._12_4_ + fVar46 * auVar76._12_4_;
  local_3f0._0_4_ = fVar57 * auVar67._0_4_ + fVar96 * auVar41._0_4_;
  local_3f0._4_4_ = fVar60 * auVar67._4_4_ + fVar108 * auVar41._4_4_;
  fStack_3e8 = fVar63 * auVar67._8_4_ + fVar127 * auVar41._8_4_;
  fStack_3e4 = fVar166 * auVar67._12_4_ + fVar46 * auVar41._12_4_;
  local_440._0_4_ = auVar97._0_4_;
  local_440._4_4_ = auVar97._4_4_;
  fStack_438 = auVar97._8_4_;
  fStack_434 = auVar97._12_4_;
  auVar97._0_4_ = fVar57 * (float)local_440._0_4_ + fVar96 * auVar77._0_4_;
  auVar97._4_4_ = fVar60 * (float)local_440._4_4_ + fVar108 * auVar77._4_4_;
  auVar97._8_4_ = fVar63 * fStack_438 + fVar127 * auVar77._8_4_;
  auVar97._12_4_ = fVar166 * fStack_434 + fVar46 * auVar77._12_4_;
  auVar153._8_4_ = 0x3f800000;
  auVar153._0_8_ = 0x3f8000003f800000;
  auVar153._12_4_ = 0x3f800000;
  local_470._0_4_ = auVar40._0_4_;
  local_470._4_4_ = auVar40._4_4_;
  fStack_468 = auVar40._8_4_;
  fStack_464 = auVar40._12_4_;
  local_470._0_4_ = fVar57 * (float)local_470._0_4_ + fVar96 * auVar66._0_4_;
  local_470._4_4_ = fVar60 * (float)local_470._4_4_ + fVar108 * auVar66._4_4_;
  fStack_468 = fVar63 * fStack_468 + fVar127 * auVar66._8_4_;
  fStack_464 = fVar166 * fStack_464 + fVar46 * auVar66._12_4_;
  local_440._0_4_ = fVar57 * auVar112._0_4_ + fVar96 * auVar109._0_4_;
  local_440._4_4_ = fVar60 * auVar112._4_4_ + fVar108 * auVar109._4_4_;
  fStack_438 = fVar63 * auVar112._8_4_ + fVar127 * auVar109._8_4_;
  fStack_434 = fVar166 * auVar112._12_4_ + fVar46 * auVar109._12_4_;
  auVar136._0_4_ = fVar57 * auVar49._0_4_ + fVar96 * auVar75._0_4_;
  auVar136._4_4_ = fVar60 * auVar49._4_4_ + fVar108 * auVar75._4_4_;
  auVar136._8_4_ = fVar63 * auVar49._8_4_ + fVar127 * auVar75._8_4_;
  auVar136._12_4_ = fVar166 * auVar49._12_4_ + fVar46 * auVar75._12_4_;
  auVar122._0_4_ = fVar57 * auVar111._0_4_ + fVar96 * auVar90._0_4_;
  auVar122._4_4_ = fVar60 * auVar111._4_4_ + fVar108 * auVar90._4_4_;
  auVar122._8_4_ = fVar63 * auVar111._8_4_ + fVar127 * auVar90._8_4_;
  auVar122._12_4_ = fVar166 * auVar111._12_4_ + fVar46 * auVar90._12_4_;
  local_370 = auVar38._0_4_;
  fStack_36c = auVar38._4_4_;
  fStack_368 = auVar38._8_4_;
  fStack_364 = auVar38._12_4_;
  auVar38._0_4_ = fVar57 * local_370 + fVar96 * auVar68._0_4_;
  auVar38._4_4_ = fVar60 * fStack_36c + fVar108 * auVar68._4_4_;
  auVar38._8_4_ = fVar63 * fStack_368 + fVar127 * auVar68._8_4_;
  auVar38._12_4_ = fVar166 * fStack_364 + fVar46 * auVar68._12_4_;
  auVar39 = vpcmpeqd_avx(auVar38,auVar38);
  auVar52 = vpcmpeqd_avx(auVar39,(undefined1  [16])(line->primIDs).field_0);
  local_1e0 = vshufps_avx(ZEXT416(uVar32),ZEXT416(uVar32),0);
  local_1f0 = *(float *)(ray + k * 4 + 0x80);
  local_200 = *(float *)(ray + k * 4 + 0xa0);
  fStack_36c = *(float *)(ray + k * 4 + 0xc0);
  auVar39 = ZEXT416((uint)(local_1f0 * local_1f0 + local_200 * local_200 + fStack_36c * fStack_36c))
  ;
  auVar67 = vshufps_avx(auVar39,auVar39,0);
  auVar39 = vrcpps_avx(auVar67);
  fVar46 = auVar39._0_4_;
  auVar40._0_4_ = fVar46 * auVar67._0_4_;
  fVar57 = auVar39._4_4_;
  auVar40._4_4_ = fVar57 * auVar67._4_4_;
  fVar60 = auVar39._8_4_;
  auVar40._8_4_ = fVar60 * auVar67._8_4_;
  fVar63 = auVar39._12_4_;
  auVar40._12_4_ = fVar63 * auVar67._12_4_;
  auVar39 = vsubps_avx(auVar153,auVar40);
  auVar49._0_4_ = (auVar149._0_4_ + (float)local_440._0_4_) * 0.5;
  auVar49._4_4_ = (auVar149._4_4_ + (float)local_440._4_4_) * 0.5;
  auVar49._8_4_ = (auVar149._8_4_ + fStack_438) * 0.5;
  auVar49._12_4_ = (auVar149._12_4_ + fStack_434) * 0.5;
  auVar75._0_4_ = (auVar136._0_4_ + (float)local_3f0._0_4_) * 0.5;
  auVar75._4_4_ = (auVar136._4_4_ + (float)local_3f0._4_4_) * 0.5;
  auVar75._8_4_ = (auVar136._8_4_ + fStack_3e8) * 0.5;
  auVar75._12_4_ = (auVar136._12_4_ + fStack_3e4) * 0.5;
  auVar66._0_4_ = (auVar122._0_4_ + auVar97._0_4_) * 0.5;
  auVar66._4_4_ = (auVar122._4_4_ + auVar97._4_4_) * 0.5;
  auVar66._8_4_ = (auVar122._8_4_ + auVar97._8_4_) * 0.5;
  auVar66._12_4_ = (auVar122._12_4_ + auVar97._12_4_) * 0.5;
  fVar96 = *(float *)(ray + k * 4 + 0x20);
  auVar90._4_4_ = fVar96;
  auVar90._0_4_ = fVar96;
  auVar90._8_4_ = fVar96;
  auVar90._12_4_ = fVar96;
  auVar67 = vsubps_avx(auVar75,auVar90);
  fVar108 = *(float *)(ray + k * 4 + 0x40);
  auVar109._4_4_ = fVar108;
  auVar109._0_4_ = fVar108;
  auVar109._8_4_ = fVar108;
  auVar109._12_4_ = fVar108;
  auVar40 = vsubps_avx(auVar66,auVar109);
  fVar127 = *(float *)(ray + k * 4);
  auVar76._4_4_ = fVar127;
  auVar76._0_4_ = fVar127;
  auVar76._8_4_ = fVar127;
  auVar76._12_4_ = fVar127;
  auVar49 = vsubps_avx(auVar49,auVar76);
  fVar47 = (local_1f0 * auVar49._0_4_ + local_200 * auVar67._0_4_ + fStack_36c * auVar40._0_4_) *
           (fVar46 + fVar46 * auVar39._0_4_);
  fVar58 = (local_1f0 * auVar49._4_4_ + local_200 * auVar67._4_4_ + fStack_36c * auVar40._4_4_) *
           (fVar57 + fVar57 * auVar39._4_4_);
  fVar61 = (local_1f0 * auVar49._8_4_ + local_200 * auVar67._8_4_ + fStack_36c * auVar40._8_4_) *
           (fVar60 + fVar60 * auVar39._8_4_);
  fVar64 = (local_1f0 * auVar49._12_4_ + local_200 * auVar67._12_4_ + fStack_36c * auVar40._12_4_) *
           (fVar63 + fVar63 * auVar39._12_4_);
  auVar154._0_4_ = fVar127 + local_1f0 * fVar47;
  auVar154._4_4_ = fVar127 + local_1f0 * fVar58;
  auVar154._8_4_ = fVar127 + local_1f0 * fVar61;
  auVar154._12_4_ = fVar127 + local_1f0 * fVar64;
  auVar128._0_4_ = fVar96 + local_200 * fVar47;
  auVar128._4_4_ = fVar96 + local_200 * fVar58;
  auVar128._8_4_ = fVar96 + local_200 * fVar61;
  auVar128._12_4_ = fVar96 + local_200 * fVar64;
  auVar77._0_4_ = fVar108 + fStack_36c * fVar47;
  auVar77._4_4_ = fVar108 + fStack_36c * fVar58;
  auVar77._8_4_ = fVar108 + fStack_36c * fVar61;
  auVar77._12_4_ = fVar108 + fStack_36c * fVar64;
  local_2e0 = vsubps_avx(auVar136,_local_3f0);
  local_2f0 = vsubps_avx(auVar122,auVar97);
  fVar96 = local_2f0._0_4_;
  fVar63 = local_2f0._4_4_;
  fVar17 = local_2f0._8_4_;
  fVar23 = local_2f0._12_4_;
  fVar108 = local_2e0._0_4_;
  fVar166 = local_2e0._4_4_;
  fVar18 = local_2e0._8_4_;
  fVar24 = local_2e0._12_4_;
  local_210 = vsubps_avx(_local_440,auVar149);
  fVar127 = local_210._0_4_;
  fVar13 = local_210._4_4_;
  fVar19 = local_210._8_4_;
  fVar25 = local_210._12_4_;
  fVar48 = fVar127 * fVar127 + fVar108 * fVar108 + fVar96 * fVar96;
  fVar59 = fVar13 * fVar13 + fVar166 * fVar166 + fVar63 * fVar63;
  fVar62 = fVar19 * fVar19 + fVar18 * fVar18 + fVar17 * fVar17;
  fVar65 = fVar25 * fVar25 + fVar24 * fVar24 + fVar23 * fVar23;
  local_3e0 = vsubps_avx(auVar128,_local_3f0);
  local_300 = vsubps_avx(auVar77,auVar97);
  fVar46 = local_300._0_4_;
  fVar14 = local_300._4_4_;
  fVar20 = local_300._8_4_;
  fVar26 = local_300._12_4_;
  fVar57 = local_3e0._0_4_;
  fVar15 = local_3e0._4_4_;
  fVar21 = local_3e0._8_4_;
  fVar27 = local_3e0._12_4_;
  _local_3f0 = vsubps_avx(auVar154,auVar149);
  fVar133 = local_3f0._0_4_;
  fVar140 = local_3f0._4_4_;
  fVar143 = local_3f0._8_4_;
  fVar146 = local_3f0._12_4_;
  fVar152 = fVar133 * fVar127 + fVar108 * fVar57 + fVar96 * fVar46;
  fVar155 = fVar140 * fVar13 + fVar166 * fVar15 + fVar63 * fVar14;
  fVar156 = fVar143 * fVar19 + fVar18 * fVar21 + fVar17 * fVar20;
  fVar157 = fVar146 * fVar25 + fVar24 * fVar27 + fVar23 * fVar26;
  auVar150._0_4_ = local_1f0 * fVar127 + local_200 * fVar108 + fVar96 * fStack_36c;
  auVar150._4_4_ = local_1f0 * fVar13 + local_200 * fVar166 + fVar63 * fStack_36c;
  auVar150._8_4_ = local_1f0 * fVar19 + local_200 * fVar18 + fVar17 * fStack_36c;
  auVar150._12_4_ = local_1f0 * fVar25 + local_200 * fVar24 + fVar23 * fStack_36c;
  local_370 = fStack_36c;
  fStack_368 = fStack_36c;
  fStack_364 = fStack_36c;
  fStack_1fc = local_200;
  fStack_1f8 = local_200;
  fStack_1f4 = local_200;
  fStack_1ec = local_1f0;
  fStack_1e8 = local_1f0;
  fStack_1e4 = local_1f0;
  auVar39 = vsubps_avx(_local_470,auVar38);
  fVar60 = auVar39._0_4_;
  fVar16 = auVar39._4_4_;
  fVar22 = auVar39._8_4_;
  fVar28 = auVar39._12_4_;
  fVar89 = fVar60 * fVar60 + fVar48;
  fVar93 = fVar16 * fVar16 + fVar59;
  fVar94 = fVar22 * fVar22 + fVar62;
  fVar95 = fVar28 * fVar28 + fVar65;
  local_220._0_4_ = fVar48 * fVar48;
  local_220._4_4_ = fVar59 * fVar59;
  fStack_218 = fVar62 * fVar62;
  fStack_214 = fVar65 * fVar65;
  auVar39._0_4_ =
       (float)local_220._0_4_ * (local_1f0 * fVar133 + local_200 * fVar57 + fStack_36c * fVar46);
  auVar39._4_4_ =
       (float)local_220._4_4_ * (local_1f0 * fVar140 + local_200 * fVar15 + fStack_36c * fVar14);
  auVar39._8_4_ = fStack_218 * (local_1f0 * fVar143 + local_200 * fVar21 + fStack_36c * fVar20);
  auVar39._12_4_ = fStack_214 * (local_1f0 * fVar146 + local_200 * fVar27 + fStack_36c * fVar26);
  auVar110._0_4_ = fVar89 * auVar150._0_4_ * fVar152;
  auVar110._4_4_ = fVar93 * auVar150._4_4_ * fVar155;
  auVar110._8_4_ = fVar94 * auVar150._8_4_ * fVar156;
  auVar110._12_4_ = fVar95 * auVar150._12_4_ * fVar157;
  auVar39 = vsubps_avx(auVar39,auVar110);
  auVar111._0_4_ = (float)local_470._0_4_ * fVar48;
  auVar111._4_4_ = (float)local_470._4_4_ * fVar59;
  auVar111._8_4_ = fStack_468 * fVar62;
  auVar111._12_4_ = fStack_464 * fVar65;
  auVar41._0_4_ = auVar150._0_4_ * fVar60 * auVar111._0_4_ + auVar39._0_4_;
  auVar41._4_4_ = auVar150._4_4_ * fVar16 * auVar111._4_4_ + auVar39._4_4_;
  auVar41._8_4_ = auVar150._8_4_ * fVar22 * auVar111._8_4_ + auVar39._8_4_;
  auVar41._12_4_ = auVar150._12_4_ * fVar28 * auVar111._12_4_ + auVar39._12_4_;
  auVar67._0_4_ = (float)local_220._0_4_ * (fVar133 * fVar133 + fVar57 * fVar57 + fVar46 * fVar46);
  auVar67._4_4_ = (float)local_220._4_4_ * (fVar140 * fVar140 + fVar15 * fVar15 + fVar14 * fVar14);
  auVar67._8_4_ = fStack_218 * (fVar143 * fVar143 + fVar21 * fVar21 + fVar20 * fVar20);
  auVar67._12_4_ = fStack_214 * (fVar146 * fVar146 + fVar27 * fVar27 + fVar26 * fVar26);
  auVar123._0_4_ = fVar152 * fVar152 * fVar89;
  auVar123._4_4_ = fVar155 * fVar155 * fVar93;
  auVar123._8_4_ = fVar156 * fVar156 * fVar94;
  auVar123._12_4_ = fVar157 * fVar157 * fVar95;
  auVar39 = vsubps_avx(auVar67,auVar123);
  auVar124._0_4_ = (fVar60 + fVar60) * fVar152;
  auVar124._4_4_ = (fVar16 + fVar16) * fVar155;
  auVar124._8_4_ = (fVar22 + fVar22) * fVar156;
  auVar124._12_4_ = (fVar28 + fVar28) * fVar157;
  auVar67 = vsubps_avx(auVar124,auVar111);
  fVar134 = auVar150._0_4_ * auVar150._0_4_;
  fVar141 = auVar150._4_4_ * auVar150._4_4_;
  fVar144 = auVar150._8_4_ * auVar150._8_4_;
  fVar147 = auVar150._12_4_ * auVar150._12_4_;
  auVar112._0_4_ = fVar134 * fVar89;
  auVar112._4_4_ = fVar141 * fVar93;
  auVar112._8_4_ = fVar144 * fVar94;
  auVar112._12_4_ = fVar147 * fVar95;
  auVar40 = vsubps_avx(_local_220,auVar112);
  auVar68._0_4_ = auVar40._0_4_ * (auVar39._0_4_ + auVar67._0_4_ * auVar111._0_4_);
  auVar68._4_4_ = auVar40._4_4_ * (auVar39._4_4_ + auVar67._4_4_ * auVar111._4_4_);
  auVar68._8_4_ = auVar40._8_4_ * (auVar39._8_4_ + auVar67._8_4_ * auVar111._8_4_);
  auVar68._12_4_ = auVar40._12_4_ * (auVar39._12_4_ + auVar67._12_4_ * auVar111._12_4_);
  auVar125._0_4_ = auVar41._0_4_ * auVar41._0_4_;
  auVar125._4_4_ = auVar41._4_4_ * auVar41._4_4_;
  auVar125._8_4_ = auVar41._8_4_ * auVar41._8_4_;
  auVar125._12_4_ = auVar41._12_4_ * auVar41._12_4_;
  auVar67 = vsubps_avx(auVar125,auVar68);
  auVar66 = ZEXT416(0) << 0x20;
  auVar39 = vcmpps_avx(auVar67,auVar66,5);
  auVar49 = auVar39 & ~auVar52;
  if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar49[0xf] < '\0') {
    auVar49 = vandnps_avx(auVar52,auVar39);
    auVar68 = vsubps_avx(auVar154,_local_440);
    auVar75 = vsubps_avx(auVar128,auVar136);
    auVar76 = vsubps_avx(auVar77,auVar122);
    auVar52 = vsqrtps_avx(auVar67);
    auVar39 = vrcpps_avx(auVar40);
    fVar135 = auVar39._0_4_;
    auVar160._0_4_ = fVar135 * auVar40._0_4_;
    fVar142 = auVar39._4_4_;
    auVar160._4_4_ = fVar142 * auVar40._4_4_;
    fVar145 = auVar39._8_4_;
    auVar160._8_4_ = fVar145 * auVar40._8_4_;
    fVar148 = auVar39._12_4_;
    auVar160._12_4_ = fVar148 * auVar40._12_4_;
    auVar80._8_4_ = 0x3f800000;
    auVar80._0_8_ = 0x3f8000003f800000;
    auVar80._12_4_ = 0x3f800000;
    auVar39 = vsubps_avx(auVar80,auVar160);
    fVar135 = fVar135 + fVar135 * auVar39._0_4_;
    fVar142 = fVar142 + fVar142 * auVar39._4_4_;
    fVar145 = fVar145 + fVar145 * auVar39._8_4_;
    fVar148 = fVar148 + fVar148 * auVar39._12_4_;
    auVar161._8_4_ = 0x7fffffff;
    auVar161._0_8_ = 0x7fffffff7fffffff;
    auVar161._12_4_ = 0x7fffffff;
    auVar39 = vandps_avx(auVar161,auVar40);
    auVar162._8_4_ = 0x219392ef;
    auVar162._0_8_ = 0x219392ef219392ef;
    auVar162._12_4_ = 0x219392ef;
    auVar39 = vcmpps_avx(auVar39,auVar162,2);
    uVar33 = CONCAT44(auVar41._4_4_,auVar41._0_4_);
    auVar163._0_8_ = uVar33 ^ 0x8000000080000000;
    auVar163._8_4_ = -auVar41._8_4_;
    auVar163._12_4_ = -auVar41._12_4_;
    auVar67 = vsubps_avx(auVar163,auVar52);
    auVar52 = vsubps_avx(auVar52,auVar41);
    auVar129._0_4_ = auVar67._0_4_ * fVar135;
    auVar129._4_4_ = auVar67._4_4_ * fVar142;
    auVar129._8_4_ = auVar67._8_4_ * fVar145;
    auVar129._12_4_ = auVar67._12_4_ * fVar148;
    auVar42._0_4_ = fVar135 * auVar52._0_4_;
    auVar42._4_4_ = fVar142 * auVar52._4_4_;
    auVar42._8_4_ = fVar145 * auVar52._8_4_;
    auVar42._12_4_ = fVar148 * auVar52._12_4_;
    auVar91._8_4_ = 0xff800000;
    auVar91._0_8_ = 0xff800000ff800000;
    auVar91._12_4_ = 0xff800000;
    auVar52 = vblendvps_avx(auVar129,auVar91,auVar39);
    auVar164._8_4_ = 0x7f800000;
    auVar164._0_8_ = 0x7f8000007f800000;
    auVar164._12_4_ = 0x7f800000;
    auVar67 = vblendvps_avx(auVar42,auVar164,auVar39);
    auVar130._0_4_ = fVar152 + auVar150._0_4_ * auVar52._0_4_;
    auVar130._4_4_ = fVar155 + auVar150._4_4_ * auVar52._4_4_;
    auVar130._8_4_ = fVar156 + auVar150._8_4_ * auVar52._8_4_;
    auVar130._12_4_ = fVar157 + auVar150._12_4_ * auVar52._12_4_;
    auVar39 = vcmpps_avx(auVar130,auVar66,6);
    auVar29._4_4_ = fVar59;
    auVar29._0_4_ = fVar48;
    auVar29._8_4_ = fVar62;
    auVar29._12_4_ = fVar65;
    auVar40 = vcmpps_avx(auVar130,auVar29,1);
    auVar39 = vandps_avx(auVar40,auVar39);
    auVar39 = vandps_avx(auVar49,auVar39);
    local_3b0 = vblendvps_avx(auVar164,auVar52,auVar39);
    local_320._0_4_ = fVar152 + auVar150._0_4_ * auVar67._0_4_;
    local_320._4_4_ = fVar155 + auVar150._4_4_ * auVar67._4_4_;
    local_320._8_4_ = fVar156 + auVar150._8_4_ * auVar67._8_4_;
    local_320._12_4_ = fVar157 + auVar150._12_4_ * auVar67._12_4_;
    auVar39 = vcmpps_avx(local_320,auVar66,6);
    auVar52 = vcmpps_avx(local_320,auVar29,1);
    auVar39 = vandps_avx(auVar52,auVar39);
    auVar39 = vandps_avx(auVar49,auVar39);
    auVar40 = vblendvps_avx(auVar91,auVar67,auVar39);
    auVar39 = vrcpps_avx(auVar150);
    fVar135 = auVar39._0_4_;
    auVar98._0_4_ = auVar150._0_4_ * fVar135;
    fVar142 = auVar39._4_4_;
    auVar98._4_4_ = auVar150._4_4_ * fVar142;
    fVar145 = auVar39._8_4_;
    auVar98._8_4_ = auVar150._8_4_ * fVar145;
    fVar148 = auVar39._12_4_;
    auVar98._12_4_ = auVar150._12_4_ * fVar148;
    auVar39 = vsubps_avx(auVar80,auVar98);
    fVar135 = fVar135 + fVar135 * auVar39._0_4_;
    fVar142 = fVar142 + fVar142 * auVar39._4_4_;
    fVar145 = fVar145 + fVar145 * auVar39._8_4_;
    fVar148 = fVar148 + fVar148 * auVar39._12_4_;
    auVar99._0_4_ = auVar150._0_4_ * fVar133;
    auVar99._4_4_ = auVar150._4_4_ * fVar140;
    auVar99._8_4_ = auVar150._8_4_ * fVar143;
    auVar99._12_4_ = auVar150._12_4_ * fVar146;
    auVar113._0_4_ = local_1f0 * fVar152;
    auVar113._4_4_ = local_1f0 * fVar155;
    auVar113._8_4_ = local_1f0 * fVar156;
    auVar113._12_4_ = local_1f0 * fVar157;
    auVar39 = vsubps_avx(auVar99,auVar113);
    auVar114._0_4_ = auVar150._0_4_ * fVar57;
    auVar114._4_4_ = auVar150._4_4_ * fVar15;
    auVar114._8_4_ = auVar150._8_4_ * fVar21;
    auVar114._12_4_ = auVar150._12_4_ * fVar27;
    auVar137._0_4_ = local_200 * fVar152;
    auVar137._4_4_ = local_200 * fVar155;
    auVar137._8_4_ = local_200 * fVar156;
    auVar137._12_4_ = local_200 * fVar157;
    auVar52 = vsubps_avx(auVar114,auVar137);
    auVar138._0_4_ = auVar150._0_4_ * fVar46;
    auVar138._4_4_ = auVar150._4_4_ * fVar14;
    auVar138._8_4_ = auVar150._8_4_ * fVar20;
    auVar138._12_4_ = auVar150._12_4_ * fVar26;
    auVar81._0_4_ = fStack_36c * fVar152;
    auVar81._4_4_ = fStack_36c * fVar155;
    auVar81._8_4_ = fStack_36c * fVar156;
    auVar81._12_4_ = fStack_36c * fVar157;
    auVar67 = vsubps_avx(auVar138,auVar81);
    auVar82._0_4_ =
         auVar39._0_4_ * auVar39._0_4_ +
         auVar52._0_4_ * auVar52._0_4_ + auVar67._0_4_ * auVar67._0_4_;
    auVar82._4_4_ =
         auVar39._4_4_ * auVar39._4_4_ +
         auVar52._4_4_ * auVar52._4_4_ + auVar67._4_4_ * auVar67._4_4_;
    auVar82._8_4_ =
         auVar39._8_4_ * auVar39._8_4_ +
         auVar52._8_4_ * auVar52._8_4_ + auVar67._8_4_ * auVar67._8_4_;
    auVar82._12_4_ =
         auVar39._12_4_ * auVar39._12_4_ +
         auVar52._12_4_ * auVar52._12_4_ + auVar67._12_4_ * auVar67._12_4_;
    auVar100._0_4_ = fVar134 * (float)local_470._0_4_ * (float)local_470._0_4_;
    auVar100._4_4_ = fVar141 * (float)local_470._4_4_ * (float)local_470._4_4_;
    auVar100._8_4_ = fVar144 * fStack_468 * fStack_468;
    auVar100._12_4_ = fVar147 * fStack_464 * fStack_464;
    auVar39 = vcmpps_avx(auVar82,auVar100,1);
    auVar101._0_4_ = fVar135 * -fVar152;
    auVar101._4_4_ = fVar142 * -fVar155;
    auVar101._8_4_ = fVar145 * -fVar156;
    auVar101._12_4_ = fVar148 * -fVar157;
    auVar52 = vblendvps_avx(auVar164,auVar101,auVar39);
    local_430._0_4_ = auVar68._0_4_;
    local_430._4_4_ = auVar68._4_4_;
    fStack_428 = auVar68._8_4_;
    fStack_424 = auVar68._12_4_;
    fVar152 = fVar127 * (float)local_430._0_4_ + auVar75._0_4_ * fVar108 + auVar76._0_4_ * fVar96;
    fVar155 = fVar13 * (float)local_430._4_4_ + auVar75._4_4_ * fVar166 + auVar76._4_4_ * fVar63;
    fVar156 = fVar19 * fStack_428 + auVar75._8_4_ * fVar18 + auVar76._8_4_ * fVar17;
    fVar157 = fVar25 * fStack_424 + auVar75._12_4_ * fVar24 + auVar76._12_4_ * fVar23;
    auVar39 = vandnps_avx(*(undefined1 (*) [16])(mm_lookupmask_ps + (ulong)line->leftExists * 0x10),
                          auVar49);
    local_380 = vblendvps_avx(auVar164,auVar52,auVar39);
    auVar83._0_4_ = auVar150._0_4_ * (float)local_430._0_4_;
    auVar83._4_4_ = auVar150._4_4_ * (float)local_430._4_4_;
    auVar83._8_4_ = auVar150._8_4_ * fStack_428;
    auVar83._12_4_ = auVar150._12_4_ * fStack_424;
    auVar78._0_4_ = auVar150._0_4_ * auVar75._0_4_;
    auVar78._4_4_ = auVar150._4_4_ * auVar75._4_4_;
    auVar78._8_4_ = auVar150._8_4_ * auVar75._8_4_;
    auVar78._12_4_ = auVar150._12_4_ * auVar75._12_4_;
    auVar50._0_4_ = auVar150._0_4_ * auVar76._0_4_;
    auVar50._4_4_ = auVar150._4_4_ * auVar76._4_4_;
    auVar50._8_4_ = auVar150._8_4_ * auVar76._8_4_;
    auVar50._12_4_ = auVar150._12_4_ * auVar76._12_4_;
    auVar102._0_4_ = local_1f0 * fVar152;
    auVar102._4_4_ = local_1f0 * fVar155;
    auVar102._8_4_ = local_1f0 * fVar156;
    auVar102._12_4_ = local_1f0 * fVar157;
    auVar39 = vsubps_avx(auVar83,auVar102);
    auVar103._0_4_ = local_200 * fVar152;
    auVar103._4_4_ = local_200 * fVar155;
    auVar103._8_4_ = local_200 * fVar156;
    auVar103._12_4_ = local_200 * fVar157;
    auVar52 = vsubps_avx(auVar78,auVar103);
    auVar104._0_4_ = fStack_36c * fVar152;
    auVar104._4_4_ = fStack_36c * fVar155;
    auVar104._8_4_ = fStack_36c * fVar156;
    auVar104._12_4_ = fStack_36c * fVar157;
    auVar67 = vsubps_avx(auVar50,auVar104);
    auVar51._0_4_ =
         auVar39._0_4_ * auVar39._0_4_ +
         auVar52._0_4_ * auVar52._0_4_ + auVar67._0_4_ * auVar67._0_4_;
    auVar51._4_4_ =
         auVar39._4_4_ * auVar39._4_4_ +
         auVar52._4_4_ * auVar52._4_4_ + auVar67._4_4_ * auVar67._4_4_;
    auVar51._8_4_ =
         auVar39._8_4_ * auVar39._8_4_ +
         auVar52._8_4_ * auVar52._8_4_ + auVar67._8_4_ * auVar67._8_4_;
    auVar51._12_4_ =
         auVar39._12_4_ * auVar39._12_4_ +
         auVar52._12_4_ * auVar52._12_4_ + auVar67._12_4_ * auVar67._12_4_;
    auVar39 = vandnps_avx(*(undefined1 (*) [16])(mm_lookupmask_ps + (ulong)line->rightExists * 0x10)
                          ,auVar49);
    auVar84._0_4_ = fVar134 * auVar38._0_4_ * auVar38._0_4_;
    auVar84._4_4_ = fVar141 * auVar38._4_4_ * auVar38._4_4_;
    auVar84._8_4_ = fVar144 * auVar38._8_4_ * auVar38._8_4_;
    auVar84._12_4_ = fVar147 * auVar38._12_4_ * auVar38._12_4_;
    auVar52 = vcmpps_avx(auVar51,auVar84,1);
    auVar43._0_4_ = fVar135 * -fVar152;
    auVar43._4_4_ = fVar142 * -fVar155;
    auVar43._8_4_ = fVar145 * -fVar156;
    auVar43._12_4_ = fVar148 * -fVar157;
    auVar52 = vblendvps_avx(auVar164,auVar43,auVar52);
    auVar39 = vblendvps_avx(auVar164,auVar52,auVar39);
    auVar38 = vminps_avx(local_380,auVar39);
    auVar52 = vmaxps_avx(local_380,auVar39);
    auVar41 = vminps_avx(local_3b0,auVar38);
    auVar67 = vcmpps_avx(auVar41,auVar38,0);
    auVar39 = vcmpps_avx(auVar164,auVar52,0);
    auVar115._8_4_ = 0xff800000;
    auVar115._0_8_ = 0xff800000ff800000;
    auVar115._12_4_ = 0xff800000;
    auVar39 = vblendvps_avx(auVar52,auVar115,auVar39);
    auVar52 = vcmpps_avx(auVar164,auVar38,0);
    auVar52 = vblendvps_avx(auVar38,auVar115,auVar52);
    auVar39 = vblendvps_avx(auVar52,auVar39,auVar67);
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar69._4_4_ = uVar1;
    auVar69._0_4_ = uVar1;
    auVar69._8_4_ = uVar1;
    auVar69._12_4_ = uVar1;
    local_1a0 = vmaxps_avx(auVar40,auVar39);
    auVar52._0_4_ = fVar47 + auVar41._0_4_;
    auVar52._4_4_ = fVar58 + auVar41._4_4_;
    auVar52._8_4_ = fVar61 + auVar41._8_4_;
    auVar52._12_4_ = fVar64 + auVar41._12_4_;
    auVar39 = vcmpps_avx(auVar69,auVar52,2);
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
    local_430._4_4_ = uVar1;
    local_430._0_4_ = uVar1;
    fStack_428 = (float)uVar1;
    fStack_424 = (float)uVar1;
    auVar52 = vcmpps_avx(auVar52,_local_430,2);
    auVar39 = vandps_avx(auVar39,auVar52);
    auVar52 = vcmpps_avx(auVar164,auVar41,4);
    local_290 = vandps_avx(auVar39,auVar52);
    local_390._0_4_ = fVar47 + local_1a0._0_4_;
    local_390._4_4_ = fVar58 + local_1a0._4_4_;
    local_390._8_4_ = fVar61 + local_1a0._8_4_;
    local_390._12_4_ = fVar64 + local_1a0._12_4_;
    auVar39 = vcmpps_avx(auVar69,local_390,2);
    auVar52 = vcmpps_avx(local_390,_local_430,2);
    auVar39 = vandps_avx(auVar39,auVar52);
    auVar52 = vandps_avx(local_290,auVar49);
    auVar67 = vcmpps_avx(local_1a0,auVar115,4);
    auVar67 = vandps_avx(auVar49,auVar67);
    local_190 = vandps_avx(auVar39,auVar67);
    auVar39 = vorps_avx(auVar52,local_190);
    uVar32 = vmovmskps_avx(auVar39);
    if (uVar32 != 0) {
      auVar67 = vblendvps_avx(local_1a0,auVar41,auVar52);
      auVar38 = vblendvps_avx(local_320,auVar130,auVar52);
      auVar30._4_4_ = fVar59;
      auVar30._0_4_ = fVar48;
      auVar30._8_4_ = fVar62;
      auVar30._12_4_ = fVar65;
      auVar39 = vrcpps_avx(auVar30);
      local_3c0 = auVar39._0_4_;
      auVar79._0_4_ = fVar48 * local_3c0;
      fStack_3bc = auVar39._4_4_;
      auVar79._4_4_ = fVar59 * fStack_3bc;
      fStack_3b8 = auVar39._8_4_;
      auVar79._8_4_ = fVar62 * fStack_3b8;
      fStack_3b4 = auVar39._12_4_;
      auVar79._12_4_ = fVar65 * fStack_3b4;
      auVar131._8_4_ = 0x3f800000;
      auVar131._0_8_ = 0x3f8000003f800000;
      auVar131._12_4_ = 0x3f800000;
      auVar39 = vsubps_avx(auVar131,auVar79);
      local_3c0 = local_3c0 + local_3c0 * auVar39._0_4_;
      fStack_3bc = fStack_3bc + fStack_3bc * auVar39._4_4_;
      fStack_3b8 = fStack_3b8 + fStack_3b8 * auVar39._8_4_;
      fStack_3b4 = fStack_3b4 + fStack_3b4 * auVar39._12_4_;
      local_470._0_4_ = fVar48 * fVar60 * (float)local_470._0_4_;
      local_470._4_4_ = fVar59 * fVar16 * (float)local_470._4_4_;
      fStack_468 = fVar62 * fVar22 * fStack_468;
      fStack_464 = fVar65 * fVar28 * fStack_464;
      local_310 = fVar108 * (float)local_470._0_4_;
      fStack_30c = fVar166 * (float)local_470._4_4_;
      fStack_308 = fVar18 * fStack_468;
      fStack_304 = fVar24 * fStack_464;
      auVar39 = vcmpps_avx(auVar67,local_3b0,0);
      auVar52 = vcmpps_avx(auVar67,auVar40,0);
      auVar39 = vorps_avx(auVar39,auVar52);
      auVar39 = vandps_avx(auVar49,auVar39);
      auVar52 = vcmpps_avx(auVar67,local_380,0);
      auVar52 = vandps_avx(auVar49,auVar52);
      fVar60 = auVar67._0_4_;
      fVar22 = auVar67._4_4_;
      fVar48 = auVar67._8_4_;
      fVar62 = auVar67._12_4_;
      auVar85._0_4_ =
           fVar127 * (float)local_470._0_4_ +
           (float)local_220._0_4_ * (local_1f0 * fVar60 + fVar133);
      auVar85._4_4_ =
           fVar13 * (float)local_470._4_4_ + (float)local_220._4_4_ * (local_1f0 * fVar22 + fVar140)
      ;
      auVar85._8_4_ = fVar19 * fStack_468 + fStack_218 * (local_1f0 * fVar48 + fVar143);
      auVar85._12_4_ = fVar25 * fStack_464 + fStack_214 * (local_1f0 * fVar62 + fVar146);
      fStack_39c = fVar13 * fVar93;
      local_3a0 = fVar127 * fVar89;
      fStack_398 = fVar19 * fVar94;
      fStack_394 = fVar25 * fVar95;
      fVar16 = auVar38._0_4_;
      auVar105._0_4_ = fVar127 * fVar89 * fVar16;
      fVar28 = auVar38._4_4_;
      auVar105._4_4_ = fVar13 * fVar93 * fVar28;
      fVar59 = auVar38._8_4_;
      auVar105._8_4_ = fVar19 * fVar94 * fVar59;
      fVar65 = auVar38._12_4_;
      auVar105._12_4_ = fVar25 * fVar95 * fVar65;
      auVar49 = vsubps_avx(auVar85,auVar105);
      local_1b0._0_8_ = local_210._0_8_ ^ 0x8000000080000000;
      local_1b0._8_4_ = -fVar19;
      local_1b0._12_4_ = -fVar25;
      auVar67 = vblendvps_avx(local_210,local_1b0,auVar52);
      local_250 = vblendvps_avx(auVar67,auVar49,auVar39);
      auVar106._0_4_ = local_310 + (float)local_220._0_4_ * (local_200 * fVar60 + fVar57);
      auVar106._4_4_ = fStack_30c + (float)local_220._4_4_ * (local_200 * fVar22 + fVar15);
      auVar106._8_4_ = fStack_308 + fStack_218 * (local_200 * fVar48 + fVar21);
      auVar106._12_4_ = fStack_304 + fStack_214 * (local_200 * fVar62 + fVar27);
      fStack_2ac = fVar166 * fVar93;
      local_2b0 = fVar108 * fVar89;
      fStack_2a8 = fVar18 * fVar94;
      fStack_2a4 = fVar24 * fVar95;
      auVar116._0_4_ = fVar16 * fVar108 * fVar89;
      auVar116._4_4_ = fVar28 * fVar166 * fVar93;
      auVar116._8_4_ = fVar59 * fVar18 * fVar94;
      auVar116._12_4_ = fVar65 * fVar24 * fVar95;
      auVar49 = vsubps_avx(auVar106,auVar116);
      local_1c0._0_8_ = local_2e0._0_8_ ^ 0x8000000080000000;
      local_1c0._8_4_ = -fVar18;
      local_1c0._12_4_ = -fVar24;
      auVar67 = vblendvps_avx(local_2e0,local_1c0,auVar52);
      local_240 = vblendvps_avx(auVar67,auVar49,auVar39);
      auVar126 = ZEXT1664(local_2f0);
      local_2a0 = fVar96 * (float)local_470._0_4_;
      fStack_29c = fVar63 * (float)local_470._4_4_;
      fStack_298 = fVar17 * fStack_468;
      fStack_294 = fVar23 * fStack_464;
      auVar159 = ZEXT1664(CONCAT412(fVar23 * fVar95,
                                    CONCAT48(fVar17 * fVar94,
                                             CONCAT44(fVar63 * fVar93,fVar96 * fVar89))));
      auVar70._0_4_ = local_2a0 + (float)local_220._0_4_ * (fVar46 + fVar60 * fStack_36c);
      auVar70._4_4_ = fStack_29c + (float)local_220._4_4_ * (fVar14 + fVar22 * fStack_36c);
      auVar70._8_4_ = fStack_298 + fStack_218 * (fVar20 + fVar48 * fStack_36c);
      auVar70._12_4_ = fStack_294 + fStack_214 * (fVar26 + fVar62 * fStack_36c);
      local_1d0._0_8_ = local_2f0._0_8_ ^ 0x8000000080000000;
      local_1d0._8_4_ = -fVar17;
      local_1d0._12_4_ = -fVar23;
      auVar117._0_4_ = fVar96 * fVar89 * fVar16;
      auVar117._4_4_ = fVar63 * fVar93 * fVar28;
      auVar117._8_4_ = fVar17 * fVar94 * fVar59;
      auVar117._12_4_ = fVar23 * fVar95 * fVar65;
      auVar67 = vblendvps_avx(local_2f0,local_1d0,auVar52);
      auVar49 = vsubps_avx(auVar70,auVar117);
      local_230 = vblendvps_avx(auVar67,auVar49,auVar39);
      auVar53._8_4_ = 0x3f800000;
      auVar53._0_8_ = 0x3f8000003f800000;
      auVar53._12_4_ = 0x3f800000;
      auVar52 = vandnps_avx(auVar52,auVar53);
      auVar139 = ZEXT1664(auVar52);
      auVar54._0_4_ = fVar16 * local_3c0;
      auVar54._4_4_ = fVar28 * fStack_3bc;
      auVar54._8_4_ = fVar59 * fStack_3b8;
      auVar54._12_4_ = fVar65 * fStack_3b4;
      local_280 = vblendvps_avx(auVar52,auVar54,auVar39);
      local_260._0_4_ = fVar60 + fVar47;
      local_260._4_4_ = fVar22 + fVar58;
      local_260._8_4_ = fVar48 + fVar61;
      local_260._12_4_ = fVar62 + fVar64;
      auVar165 = ZEXT864(0) << 0x20;
      local_270 = ZEXT816(0) << 0x20;
      uVar34 = 1 << ((byte)k & 0x1f);
      uVar33 = (ulong)(uVar32 & 0xff);
      auVar121 = ZEXT1664(local_2e0);
      auVar151 = ZEXT1664(local_3e0);
      auVar158 = ZEXT1664(local_300);
      auVar132 = ZEXT1664(_local_3f0);
      local_3d0 = pSVar35;
      local_3c8 = ray;
      local_358 = line;
      do {
        local_350.valid = (int *)local_420;
        auVar52 = auVar126._0_16_;
        auVar39 = auVar121._0_16_;
        auVar49 = auVar139._0_16_;
        auVar66 = auVar159._0_16_;
        auVar41 = auVar158._0_16_;
        auVar38 = auVar151._0_16_;
        auVar67 = auVar132._0_16_;
        uVar12 = 0;
        if (uVar33 != 0) {
          for (; (uVar33 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        uVar32 = *(uint *)(local_1e0 + uVar12 * 4);
        pGVar7 = (pSVar35->geometries).items[uVar32].ptr;
        if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar36 = true, pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0))
          goto LAB_00880ca9;
          local_120 = *(undefined4 *)(local_280 + uVar12 * 4);
          local_100 = *(undefined4 *)(local_270 + uVar12 * 4);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_260 + uVar12 * 4);
          local_350.context = context->user;
          local_e0 = (local_358->primIDs).field_0.i[uVar12];
          uVar2 = *(undefined4 *)(local_250 + uVar12 * 4);
          auVar88._4_4_ = uVar2;
          auVar88._0_4_ = uVar2;
          auVar88._8_4_ = uVar2;
          auVar88._12_4_ = uVar2;
          auVar88._16_4_ = uVar2;
          auVar88._20_4_ = uVar2;
          auVar88._24_4_ = uVar2;
          auVar88._28_4_ = uVar2;
          uVar3 = *(undefined4 *)(local_240 + uVar12 * 4);
          local_160._4_4_ = uVar3;
          local_160._0_4_ = uVar3;
          local_160._8_4_ = uVar3;
          local_160._12_4_ = uVar3;
          local_160._16_4_ = uVar3;
          local_160._20_4_ = uVar3;
          local_160._24_4_ = uVar3;
          local_160._28_4_ = uVar3;
          local_b0 = vpshufd_avx(ZEXT416(uVar32),0);
          uVar3 = *(undefined4 *)(local_230 + uVar12 * 4);
          local_140._4_4_ = uVar3;
          local_140._0_4_ = uVar3;
          local_140._8_4_ = uVar3;
          local_140._12_4_ = uVar3;
          local_140._16_4_ = uVar3;
          local_140._20_4_ = uVar3;
          local_140._24_4_ = uVar3;
          local_140._28_4_ = uVar3;
          local_180[0] = (RTCHitN)(char)uVar2;
          local_180[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[4] = (RTCHitN)(char)uVar2;
          local_180[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[8] = (RTCHitN)(char)uVar2;
          local_180[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[0xc] = (RTCHitN)(char)uVar2;
          local_180[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[0x10] = (RTCHitN)(char)uVar2;
          local_180[0x11] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[0x12] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[0x13] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[0x14] = (RTCHitN)(char)uVar2;
          local_180[0x15] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[0x16] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[0x17] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[0x18] = (RTCHitN)(char)uVar2;
          local_180[0x19] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[0x1a] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[0x1b] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[0x1c] = (RTCHitN)(char)uVar2;
          local_180[0x1d] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[0x1e] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[0x1f] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          auVar88 = vcmpps_avx(auVar88,auVar88,0xf);
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = local_b0;
          uStack_9c = (local_350.context)->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = (local_350.context)->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          local_420 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar34 & 0xf) << 4));
          local_410 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar34 >> 4) * 0x10);
          local_350.geometryUserPtr = pGVar7->userPtr;
          local_350.hit = local_180;
          local_350.N = 8;
          local_350.ray = (RTCRayN *)ray;
          if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar88 = ZEXT1632(auVar88._0_16_);
            local_2d0 = auVar49;
            local_2c0 = auVar66;
            (*pGVar7->occlusionFilterN)(&local_350);
            auVar88 = vcmpps_avx(auVar88,auVar88,0xf);
            auVar165 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar139 = ZEXT1664(local_2d0);
            auVar159 = ZEXT1664(local_2c0);
            auVar132 = ZEXT1664(_local_3f0);
            auVar158 = ZEXT1664(local_300);
            auVar151 = ZEXT1664(local_3e0);
            auVar126 = ZEXT1664(local_2f0);
            auVar121 = ZEXT1664(local_2e0);
            pSVar35 = local_3d0;
          }
          auVar39 = vpcmpeqd_avx(auVar165._0_16_,local_420);
          auVar52 = vpcmpeqd_avx(auVar165._0_16_,local_410);
          auVar71._16_16_ = auVar52;
          auVar71._0_16_ = auVar39;
          auVar71 = auVar88 & ~auVar71;
          if ((((((((auVar71 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar71 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar71 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar71 >> 0x7f,0) == '\0') &&
                (auVar71 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar71 >> 0xbf,0) == '\0') &&
              (auVar71 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar71[0x1f]) {
            auVar44._0_4_ = auVar39._0_4_ ^ auVar88._0_4_;
            auVar44._4_4_ = auVar39._4_4_ ^ auVar88._4_4_;
            auVar44._8_4_ = auVar39._8_4_ ^ auVar88._8_4_;
            auVar44._12_4_ = auVar39._12_4_ ^ auVar88._12_4_;
            auVar44._16_4_ = auVar52._0_4_ ^ auVar88._16_4_;
            auVar44._20_4_ = auVar52._4_4_ ^ auVar88._20_4_;
            auVar44._24_4_ = auVar52._8_4_ ^ auVar88._24_4_;
            auVar44._28_4_ = auVar52._12_4_ ^ auVar88._28_4_;
          }
          else {
            p_Var11 = context->args->filter;
            if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
              local_2c0 = auVar159._0_16_;
              local_2d0 = auVar139._0_16_;
              auVar88 = ZEXT1632(auVar88._0_16_);
              (*p_Var11)(&local_350);
              auVar88 = vcmpps_avx(auVar88,auVar88,0xf);
              auVar165 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar139 = ZEXT1664(local_2d0);
              auVar159 = ZEXT1664(local_2c0);
              auVar132 = ZEXT1664(_local_3f0);
              auVar158 = ZEXT1664(local_300);
              auVar151 = ZEXT1664(local_3e0);
              auVar126 = ZEXT1664(local_2f0);
              auVar121 = ZEXT1664(local_2e0);
              pSVar35 = local_3d0;
            }
            auVar39 = vpcmpeqd_avx(auVar165._0_16_,local_420);
            auVar52 = vpcmpeqd_avx(auVar165._0_16_,local_410);
            auVar55._16_16_ = auVar52;
            auVar55._0_16_ = auVar39;
            auVar44._0_4_ = auVar39._0_4_ ^ auVar88._0_4_;
            auVar44._4_4_ = auVar39._4_4_ ^ auVar88._4_4_;
            auVar44._8_4_ = auVar39._8_4_ ^ auVar88._8_4_;
            auVar44._12_4_ = auVar39._12_4_ ^ auVar88._12_4_;
            auVar44._16_4_ = auVar52._0_4_ ^ auVar88._16_4_;
            auVar44._20_4_ = auVar52._4_4_ ^ auVar88._20_4_;
            auVar44._24_4_ = auVar52._8_4_ ^ auVar88._24_4_;
            auVar44._28_4_ = auVar52._12_4_ ^ auVar88._28_4_;
            auVar72._8_4_ = 0xff800000;
            auVar72._0_8_ = 0xff800000ff800000;
            auVar72._12_4_ = 0xff800000;
            auVar72._16_4_ = 0xff800000;
            auVar72._20_4_ = 0xff800000;
            auVar72._24_4_ = 0xff800000;
            auVar72._28_4_ = 0xff800000;
            auVar88 = vblendvps_avx(auVar72,*(undefined1 (*) [32])(local_350.ray + 0x100),auVar55);
            *(undefined1 (*) [32])(local_350.ray + 0x100) = auVar88;
          }
          auVar52 = auVar126._0_16_;
          auVar39 = auVar121._0_16_;
          auVar49 = auVar139._0_16_;
          auVar66 = auVar159._0_16_;
          auVar41 = auVar158._0_16_;
          auVar38 = auVar151._0_16_;
          auVar67 = auVar132._0_16_;
          if ((((((((auVar44 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar44 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar44 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar44 >> 0x7f,0) != '\0') ||
                (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar44 >> 0xbf,0) != '\0') ||
              (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar44[0x1f] < '\0') {
            _local_430 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
            bVar36 = true;
            goto LAB_00880ca9;
          }
          *(undefined4 *)(ray + k * 4 + 0x100) = uVar1;
        }
        auVar52 = auVar126._0_16_;
        auVar39 = auVar121._0_16_;
        auVar49 = auVar139._0_16_;
        auVar66 = auVar159._0_16_;
        auVar41 = auVar158._0_16_;
        auVar38 = auVar151._0_16_;
        auVar67 = auVar132._0_16_;
        uVar33 = uVar33 ^ 1L << (uVar12 & 0x3f);
      } while (uVar33 != 0);
      bVar36 = false;
LAB_00880ca9:
      auVar68 = vpermilps_avx(_local_430,0);
      auVar75 = vcmpps_avx(local_390,auVar68,2);
      auVar68 = vandps_avx(local_190,local_290);
      auVar68 = vandps_avx(auVar68,auVar75);
      uVar32 = vmovmskps_avx(auVar68);
      if (uVar32 == 0) {
        return bVar36;
      }
      auVar75 = vcmpps_avx(local_1a0,local_380,0);
      auVar68 = vblendvps_avx(local_210,local_1b0,auVar75);
      auVar39 = vblendvps_avx(auVar39,local_1c0,auVar75);
      auVar52 = vblendvps_avx(auVar52,local_1d0,auVar75);
      auVar75 = vcmpps_avx(local_1a0,local_3b0,0);
      auVar40 = vcmpps_avx(local_1a0,auVar40,0);
      auVar40 = vorps_avx(auVar75,auVar40);
      fVar96 = local_1a0._0_4_;
      fVar108 = local_1a0._4_4_;
      fVar46 = local_1a0._8_4_;
      fVar57 = local_1a0._12_4_;
      auVar86._0_4_ =
           (float)local_220._0_4_ * (auVar67._0_4_ + fVar96 * local_1f0) +
           fVar127 * (float)local_470._0_4_;
      auVar86._4_4_ =
           (float)local_220._4_4_ * (auVar67._4_4_ + fVar108 * fStack_1ec) +
           fVar13 * (float)local_470._4_4_;
      auVar86._8_4_ = fStack_218 * (auVar67._8_4_ + fVar46 * fStack_1e8) + fVar19 * fStack_468;
      auVar86._12_4_ = fStack_214 * (auVar67._12_4_ + fVar57 * fStack_1e4) + fVar25 * fStack_464;
      auVar92._0_4_ = (float)local_220._0_4_ * (auVar38._0_4_ + fVar96 * local_200) + local_310;
      auVar92._4_4_ = (float)local_220._4_4_ * (auVar38._4_4_ + fVar108 * fStack_1fc) + fStack_30c;
      auVar92._8_4_ = fStack_218 * (auVar38._8_4_ + fVar46 * fStack_1f8) + fStack_308;
      auVar92._12_4_ = fStack_214 * (auVar38._12_4_ + fVar57 * fStack_1f4) + fStack_304;
      auVar107._0_4_ = (float)local_220._0_4_ * (auVar41._0_4_ + fVar96 * local_370) + local_2a0;
      auVar107._4_4_ = (float)local_220._4_4_ * (auVar41._4_4_ + fVar108 * fStack_36c) + fStack_29c;
      auVar107._8_4_ = fStack_218 * (auVar41._8_4_ + fVar46 * fStack_368) + fStack_298;
      auVar107._12_4_ = fStack_214 * (auVar41._12_4_ + fVar57 * fStack_364) + fStack_294;
      fVar96 = local_320._0_4_;
      auVar118._0_4_ = fVar96 * local_3a0;
      fVar108 = local_320._4_4_;
      auVar118._4_4_ = fVar108 * fStack_39c;
      fVar127 = local_320._8_4_;
      auVar118._8_4_ = fVar127 * fStack_398;
      fVar46 = local_320._12_4_;
      auVar118._12_4_ = fVar46 * fStack_394;
      auVar67 = vsubps_avx(auVar86,auVar118);
      auVar119._0_4_ = fVar96 * local_2b0;
      auVar119._4_4_ = fVar108 * fStack_2ac;
      auVar119._8_4_ = fVar127 * fStack_2a8;
      auVar119._12_4_ = fVar46 * fStack_2a4;
      auVar38 = vsubps_avx(auVar92,auVar119);
      auVar120._0_4_ = auVar66._0_4_ * fVar96;
      auVar120._4_4_ = auVar66._4_4_ * fVar108;
      auVar120._8_4_ = auVar66._8_4_ * fVar127;
      auVar120._12_4_ = auVar66._12_4_ * fVar46;
      auVar41 = vsubps_avx(auVar107,auVar120);
      local_250 = vblendvps_avx(auVar68,auVar67,auVar40);
      local_240 = vblendvps_avx(auVar39,auVar38,auVar40);
      local_230 = vblendvps_avx(auVar52,auVar41,auVar40);
      auVar87._0_4_ = fVar96 * local_3c0;
      auVar87._4_4_ = fVar108 * fStack_3bc;
      auVar87._8_4_ = fVar127 * fStack_3b8;
      auVar87._12_4_ = fVar46 * fStack_3b4;
      local_280 = vblendvps_avx(auVar49,auVar87,auVar40);
      auVar121 = ZEXT464(0) << 0x20;
      local_270 = ZEXT416(0) << 0x20;
      local_260 = local_390;
      pSVar35 = context->scene;
      uVar33 = (ulong)(uVar32 & 0xff);
      auVar88 = vcmpps_avx(ZEXT1632(local_320),ZEXT1632(local_320),0xf);
      auVar126 = ZEXT3264(auVar88);
      do {
        local_350.valid = (int *)local_420;
        uVar12 = 0;
        if (uVar33 != 0) {
          for (; (uVar33 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        uVar32 = *(uint *)(local_1e0 + uVar12 * 4);
        pGVar7 = (pSVar35->geometries).items[uVar32].ptr;
        if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar31 = 1, pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_008810d7;
          local_120 = *(undefined4 *)(local_280 + uVar12 * 4);
          local_100 = *(undefined4 *)(local_270 + uVar12 * 4);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_260 + uVar12 * 4);
          local_350.context = context->user;
          local_e0 = (local_358->primIDs).field_0.i[uVar12];
          uVar1 = *(undefined4 *)(local_250 + uVar12 * 4);
          uVar2 = *(undefined4 *)(local_240 + uVar12 * 4);
          local_160._4_4_ = uVar2;
          local_160._0_4_ = uVar2;
          local_160._8_4_ = uVar2;
          local_160._12_4_ = uVar2;
          local_160._16_4_ = uVar2;
          local_160._20_4_ = uVar2;
          local_160._24_4_ = uVar2;
          local_160._28_4_ = uVar2;
          local_b0 = vpshufd_avx(ZEXT416(uVar32),0);
          uVar2 = *(undefined4 *)(local_230 + uVar12 * 4);
          local_140._4_4_ = uVar2;
          local_140._0_4_ = uVar2;
          local_140._8_4_ = uVar2;
          local_140._12_4_ = uVar2;
          local_140._16_4_ = uVar2;
          local_140._20_4_ = uVar2;
          local_140._24_4_ = uVar2;
          local_140._28_4_ = uVar2;
          local_180[0] = (RTCHitN)(char)uVar1;
          local_180[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[4] = (RTCHitN)(char)uVar1;
          local_180[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[8] = (RTCHitN)(char)uVar1;
          local_180[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[0xc] = (RTCHitN)(char)uVar1;
          local_180[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[0x10] = (RTCHitN)(char)uVar1;
          local_180[0x11] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[0x12] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0x13] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[0x14] = (RTCHitN)(char)uVar1;
          local_180[0x15] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[0x16] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0x17] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[0x18] = (RTCHitN)(char)uVar1;
          local_180[0x19] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[0x1a] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0x1b] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[0x1c] = (RTCHitN)(char)uVar1;
          local_180[0x1d] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[0x1e] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0x1f] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = local_b0;
          uStack_9c = (local_350.context)->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = (local_350.context)->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          local_420 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar34 & 0xf) << 4));
          local_410 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar34 >> 4) * 0x10);
          local_350.geometryUserPtr = pGVar7->userPtr;
          local_350.hit = local_180;
          local_350.N = 8;
          local_350.ray = (RTCRayN *)ray;
          if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar88 = ZEXT1632(auVar126._0_16_);
            (*pGVar7->occlusionFilterN)(&local_350);
            auVar88 = vcmpps_avx(auVar88,auVar88,0xf);
            auVar126 = ZEXT3264(auVar88);
            auVar121 = ZEXT1664(ZEXT816(0) << 0x40);
            ray = local_3c8;
          }
          auVar39 = vpcmpeqd_avx(local_420,auVar121._0_16_);
          auVar52 = vpcmpeqd_avx(local_410,auVar121._0_16_);
          auVar73._16_16_ = auVar52;
          auVar73._0_16_ = auVar39;
          auVar88 = auVar126._0_32_ & ~auVar73;
          if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar88 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar88 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar88 >> 0x7f,0) == '\0') &&
                (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar88 >> 0xbf,0) == '\0') &&
              (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar88[0x1f]) {
            auVar45._0_4_ = auVar126._0_4_ ^ auVar39._0_4_;
            auVar45._4_4_ = auVar126._4_4_ ^ auVar39._4_4_;
            auVar45._8_4_ = auVar126._8_4_ ^ auVar39._8_4_;
            auVar45._12_4_ = auVar126._12_4_ ^ auVar39._12_4_;
            auVar45._16_4_ = auVar126._16_4_ ^ auVar52._0_4_;
            auVar45._20_4_ = auVar126._20_4_ ^ auVar52._4_4_;
            auVar45._24_4_ = auVar126._24_4_ ^ auVar52._8_4_;
            auVar45._28_4_ = auVar126._28_4_ ^ auVar52._12_4_;
          }
          else {
            p_Var11 = context->args->filter;
            if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
              auVar88 = ZEXT1632(auVar126._0_16_);
              (*p_Var11)(&local_350);
              auVar88 = vcmpps_avx(auVar88,auVar88,0xf);
              auVar126 = ZEXT3264(auVar88);
              auVar121 = ZEXT1664(ZEXT816(0) << 0x40);
              ray = local_3c8;
            }
            auVar39 = vpcmpeqd_avx(local_420,auVar121._0_16_);
            auVar52 = vpcmpeqd_avx(local_410,auVar121._0_16_);
            auVar56._16_16_ = auVar52;
            auVar56._0_16_ = auVar39;
            auVar45._0_4_ = auVar126._0_4_ ^ auVar39._0_4_;
            auVar45._4_4_ = auVar126._4_4_ ^ auVar39._4_4_;
            auVar45._8_4_ = auVar126._8_4_ ^ auVar39._8_4_;
            auVar45._12_4_ = auVar126._12_4_ ^ auVar39._12_4_;
            auVar45._16_4_ = auVar126._16_4_ ^ auVar52._0_4_;
            auVar45._20_4_ = auVar126._20_4_ ^ auVar52._4_4_;
            auVar45._24_4_ = auVar126._24_4_ ^ auVar52._8_4_;
            auVar45._28_4_ = auVar126._28_4_ ^ auVar52._12_4_;
            auVar74._8_4_ = 0xff800000;
            auVar74._0_8_ = 0xff800000ff800000;
            auVar74._12_4_ = 0xff800000;
            auVar74._16_4_ = 0xff800000;
            auVar74._20_4_ = 0xff800000;
            auVar74._24_4_ = 0xff800000;
            auVar74._28_4_ = 0xff800000;
            auVar88 = vblendvps_avx(auVar74,*(undefined1 (*) [32])(local_350.ray + 0x100),auVar56);
            *(undefined1 (*) [32])(local_350.ray + 0x100) = auVar88;
          }
          if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar45 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar45 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar45 >> 0x7f,0) != '\0') ||
                (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar45 >> 0xbf,0) != '\0') ||
              (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar45[0x1f] < '\0') {
            bVar31 = 1;
            goto LAB_008810d7;
          }
          *(int *)(ray + k * 4 + 0x100) = local_430._0_4_;
        }
        uVar33 = uVar33 ^ 1L << (uVar12 & 0x3f);
        if (uVar33 == 0) {
          bVar31 = 0;
LAB_008810d7:
          return (bool)(bVar36 | bVar31);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom,ray.time()[k]);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }